

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

double __thiscall Imath_3_2::Vec3<double>::lengthTiny(Vec3<double> *this)

{
  double *in_RDI;
  double max;
  double absZ;
  double absY;
  double absX;
  double local_50;
  double local_48;
  double local_40;
  double local_30;
  double local_8;
  
  if (*in_RDI < 0.0) {
    local_40 = -*in_RDI;
  }
  else {
    local_40 = *in_RDI;
  }
  if (in_RDI[1] < 0.0) {
    local_48 = -in_RDI[1];
  }
  else {
    local_48 = in_RDI[1];
  }
  if (in_RDI[2] < 0.0) {
    local_50 = -in_RDI[2];
  }
  else {
    local_50 = in_RDI[2];
  }
  local_30 = local_40;
  if (local_40 < local_48) {
    local_30 = local_48;
  }
  if (local_30 < local_50) {
    local_30 = local_50;
  }
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_8 = sqrt((local_50 / local_30) * (local_50 / local_30) +
                   (local_40 / local_30) * (local_40 / local_30) +
                   (local_48 / local_30) * (local_48 / local_30));
    local_8 = local_30 * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec3<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * std::sqrt (absX * absX + absY * absY + absZ * absZ);
}